

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

bool __thiscall
trieste::detail::Inside<2UL>::match(Inside<2UL> *this,NodeIt *it,Node *parent,Match *match)

{
  element_type *peVar1;
  uint uVar2;
  TokenDef *pTVar3;
  bool bVar4;
  bool bVar5;
  
  pTVar3 = (((parent->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           type_).def;
  bVar4 = pTVar3 == (this->types)._M_elems[0].def;
  bVar5 = pTVar3 == (this->types)._M_elems[1].def;
  if (bVar5 || bVar4) {
    peVar1 = (this->super_PatternDef).continuation.
             super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      pTVar3 = (TokenDef *)0x1;
    }
    else {
      uVar2 = (*peVar1->_vptr_PatternDef[4])();
      pTVar3 = (TokenDef *)(ulong)uVar2;
    }
  }
  return (bool)((bVar5 || bVar4) & (byte)pTVar3);
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        for (const auto& type : types)
        {
          if (parent->type() == type)
            return match_continuation(it, parent, match);
        }

        return false;
      }